

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

void __thiscall Assimp::STEP::DB::SetInverseIndicesToTrack(DB *this,char **types,size_t N)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
  *this_00;
  const_iterator cVar1;
  char *pcVar2;
  size_t sVar3;
  char *sz;
  allocator<char> local_61;
  char **local_60;
  char *local_58;
  key_type local_50;
  
  if (N != 0) {
    sVar3 = 0;
    local_60 = types;
    do {
      this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
                 *)this->schema;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,local_60[sVar3],&local_61);
      cVar1 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::STEP::Object_*(*)(const_Assimp::STEP::DB_&,_const_Assimp::STEP::EXPRESS::LIST_&)>_>_>
              ::find(this_00,&local_50);
      if ((_Rb_tree_header *)cVar1._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = *(char **)(cVar1._M_node + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_58 = pcVar2;
      if (pcVar2 == (char *)0x0) {
        __assert_fail("sz",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/./code/Step/STEPFile.h"
                      ,0x3db,
                      "void Assimp::STEP::DB::SetInverseIndicesToTrack(const char *const *, size_t)"
                     );
      }
      std::
      _Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
      ::_M_insert_unique<char_const*const&>
                ((_Rb_tree<char_const*,char_const*,std::_Identity<char_const*>,std::less<char_const*>,std::allocator<char_const*>>
                  *)&this->inv_whitelist,&local_58);
      sVar3 = sVar3 + 1;
    } while (N != sVar3);
  }
  return;
}

Assistant:

void SetInverseIndicesToTrack( const char* const* types, size_t N ) {
            for(size_t i = 0; i < N;++i) {
                const char* const sz = schema->GetStaticStringForToken(types[i]);
                ai_assert(sz);
                inv_whitelist.insert(sz);
            }
        }